

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.h
# Opt level: O0

int8_t get_uni_comp_ref_idx(MV_REFERENCE_FRAME *rf)

{
  char cVar1;
  MV_REFERENCE_FRAME MVar2;
  char *in_RDI;
  int8_t ref_idx;
  char local_11;
  
  if (('\0' < in_RDI[1]) && (('\x04' < *in_RDI || (in_RDI[1] < '\x05')))) {
    for (local_11 = '\0'; local_11 < '\t'; local_11 = local_11 + '\x01') {
      cVar1 = *in_RDI;
      MVar2 = comp_ref0((int)local_11);
      if ((cVar1 == MVar2) && (cVar1 = in_RDI[1], MVar2 = comp_ref1((int)local_11), cVar1 == MVar2))
      {
        return local_11;
      }
    }
  }
  return -1;
}

Assistant:

static inline int8_t get_uni_comp_ref_idx(const MV_REFERENCE_FRAME *const rf) {
  // Single ref pred
  if (rf[1] <= INTRA_FRAME) return -1;

  // Bi-directional comp ref pred
  if ((rf[0] < BWDREF_FRAME) && (rf[1] >= BWDREF_FRAME)) return -1;

  for (int8_t ref_idx = 0; ref_idx < TOTAL_UNIDIR_COMP_REFS; ++ref_idx) {
    if (rf[0] == comp_ref0(ref_idx) && rf[1] == comp_ref1(ref_idx))
      return ref_idx;
  }
  return -1;
}